

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O2

axbStatus_t axbVecAXPY(axbVec_s *y,axbScalar_s *alpha,axbVec_s *x)

{
  axbStatus_t aVar1;
  
  if ((x->init == 0x1d232) && (y->init == 0x1d232)) {
    (*y->opBackend->op_table[0x10].func)();
    aVar1 = 0;
  }
  else {
    fwrite("Vector not fully initialized!\n",0x1e,1,_stderr);
    aVar1 = 0x1d232;
  }
  return aVar1;
}

Assistant:

axbStatus_t axbVecAXPY(struct axbVec_s *y, const struct axbScalar_s *alpha, const struct axbVec_s *x)
{
  AXB_VECTOR_INIT_CHECK(x);
  AXB_VECTOR_INIT_CHECK(y);

  axbOpDescriptor_t op_desc = y->opBackend->op_table[AXB_OP_VEC_AXPY];
  axbStatus_t (*op)(struct axbVec_s *, const struct axbScalar_s *, const struct axbVec_s *, void*) = (axbStatus_t (*)(struct axbVec_s *, const struct axbScalar_s *, const struct axbVec_s *, void*)) op_desc.func;
  op(y, alpha, x, op_desc.func_data);
  return 0;
}